

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_acceptance.c
# Opt level: O1

REF_STATUS ref_acceptance_q(REF_NODE ref_node,char *function_name,REF_INT *ldim,REF_DBL **scalar)

{
  long lVar1;
  REF_DBL *pRVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  REF_STATUS RVar6;
  REF_DBL *pRVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  REF_DBL primitive [6];
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  REF_DBL local_48;
  REF_DBL RStack_40;
  
  *ldim = 5;
  iVar3 = strcmp(function_name,"fp-sa");
  iVar9 = (iVar3 == 0) + 5;
  *ldim = iVar9;
  iVar4 = strcmp(function_name,"sst");
  iVar3 = 7;
  if (iVar4 != 0) {
    iVar3 = iVar9;
  }
  *ldim = iVar3;
  uVar5 = iVar3 * ref_node->max;
  if ((int)uVar5 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c",
           0x1aa,"ref_acceptance_q","malloc *scalar of REF_DBL negative");
    RVar6 = 1;
  }
  else {
    pRVar7 = (REF_DBL *)malloc((ulong)uVar5 << 3);
    *scalar = pRVar7;
    if (pRVar7 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c",
             0x1aa,"ref_acceptance_q","malloc *scalar of REF_DBL NULL");
      RVar6 = 2;
    }
    else {
      if (0 < ref_node->max) {
        lVar10 = 0;
        do {
          if (-1 < ref_node->global[lVar10]) {
            iVar3 = strcmp(function_name,"trig");
            iVar4 = (int)lVar10;
            if (iVar3 == 0) {
              ref_acceptance_primal_trig
                        (ref_node->real[lVar10 * 0xf],ref_node->real[lVar10 * 0xf + 1],
                         (REF_DBL *)&local_68);
            }
            else {
              iVar3 = strcmp(function_name,"vortex");
              if (iVar3 == 0) {
                ref_acceptance_primal_vortex
                          (ref_node->real[lVar10 * 0xf],ref_node->real[lVar10 * 0xf + 1],
                           (REF_DBL *)&local_68);
              }
              else {
                iVar3 = strcmp(function_name,"coax");
                if (iVar3 != 0) {
                  iVar3 = strcmp(function_name,"ringleb");
                  if (iVar3 == 0) {
                    uVar5 = ref_acceptance_primal_ringleb
                                      (ref_node->real[lVar10 * 0xf],ref_node->real[lVar10 * 0xf + 1]
                                       ,(REF_DBL *)&local_68);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                             ,0x1cb,"ref_acceptance_q",(ulong)uVar5,"ringleb");
                      return uVar5;
                    }
                    pRVar7 = *scalar;
                    lVar8 = (long)iVar4 * (long)*ldim;
                    pRVar7[lVar8 + 4] = local_48;
                  }
                  else {
                    iVar3 = strcmp(function_name,"fp-sa");
                    if (iVar3 != 0) {
                      iVar3 = strcmp(function_name,"sst");
                      if (iVar3 != 0) {
                        printf("%s: %d: %s %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                               ,0x1d8,"unknown user function",function_name);
                        return 5;
                      }
                      iVar3 = *ldim;
                      pRVar7 = *scalar;
                      lVar8 = 0;
                      do {
                        lVar1 = lVar8 + 1;
                        pRVar7[(long)iVar4 * (long)iVar3 + lVar8] = (double)(int)lVar1;
                        lVar8 = lVar1;
                      } while (lVar1 != 7);
                      goto LAB_00110f31;
                    }
                    uVar5 = ref_acceptance_primal_fp_sa
                                      (ref_node->real[lVar10 * 0xf + 1],(REF_DBL *)&local_68);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                             ,0x1d2,"ref_acceptance_q",(ulong)uVar5,"flat plate sa");
                      return uVar5;
                    }
                    pRVar7 = *scalar;
                    lVar8 = (long)iVar4 * (long)*ldim;
                    pRVar7[lVar8 + 4] = local_48;
                    (pRVar7 + lVar8 + 4)[1] = RStack_40;
                  }
                  pRVar2 = pRVar7 + lVar8 + 2;
                  *(undefined4 *)pRVar2 = local_58;
                  *(undefined4 *)((long)pRVar2 + 4) = uStack_54;
                  *(undefined4 *)(pRVar2 + 1) = uStack_50;
                  *(undefined4 *)((long)pRVar2 + 0xc) = uStack_4c;
                  pRVar7 = pRVar7 + lVar8;
                  *(undefined4 *)pRVar7 = local_68;
                  *(undefined4 *)((long)pRVar7 + 4) = uStack_64;
                  *(undefined4 *)(pRVar7 + 1) = uStack_60;
                  *(undefined4 *)((long)pRVar7 + 0xc) = uStack_5c;
                  goto LAB_00110f31;
                }
                ref_acceptance_primal_coax
                          (ref_node->real[lVar10 * 0xf],ref_node->real[lVar10 * 0xf + 1],
                           (REF_DBL *)&local_68);
              }
            }
            pRVar7 = *scalar;
            lVar8 = (long)iVar4 * (long)*ldim;
            pRVar7[lVar8 + 4] = local_48;
            pRVar7[lVar8 + 2] = (REF_DBL)CONCAT44(uStack_54,local_58);
            (pRVar7 + lVar8 + 2)[1] = (REF_DBL)CONCAT44(uStack_4c,uStack_50);
            pRVar7[lVar8] = (REF_DBL)CONCAT44(uStack_64,local_68);
            (pRVar7 + lVar8)[1] = (REF_DBL)CONCAT44(uStack_5c,uStack_60);
          }
LAB_00110f31:
          lVar10 = lVar10 + 1;
        } while (lVar10 < ref_node->max);
      }
      RVar6 = 0;
    }
  }
  return RVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_acceptance_q(REF_NODE ref_node,
                                           const char *function_name,
                                           REF_INT *ldim, REF_DBL **scalar) {
  REF_INT node;

  *ldim = 5;
  if (strcmp(function_name, "fp-sa") == 0) {
    *ldim = 6;
  }
  if (strcmp(function_name, "sst") == 0) {
    *ldim = 7;
  }
  ref_malloc(*scalar, (*ldim) * ref_node_max(ref_node), REF_DBL);

  each_ref_node_valid_node(ref_node, node) {
    if (strcmp(function_name, "trig") == 0) {
      REF_INT i;
      REF_DBL primitive[5];
      RSS(ref_acceptance_primal_trig(ref_node_xyz(ref_node, 0, node),
                                     ref_node_xyz(ref_node, 1, node),
                                     primitive),
          "trig");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
    } else if (strcmp(function_name, "vortex") == 0) {
      REF_INT i;
      REF_DBL primitive[5];
      RSS(ref_acceptance_primal_vortex(ref_node_xyz(ref_node, 0, node),
                                       ref_node_xyz(ref_node, 1, node),
                                       primitive),
          "vortex");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
    } else if (strcmp(function_name, "coax") == 0) {
      REF_INT i;
      REF_DBL primitive[5];
      RSS(ref_acceptance_primal_coax(ref_node_xyz(ref_node, 0, node),
                                     ref_node_xyz(ref_node, 1, node),
                                     primitive),
          "coax");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
    } else if (strcmp(function_name, "ringleb") == 0) {
      REF_INT i;
      REF_DBL primitive[5];
      RSS(ref_acceptance_primal_ringleb(ref_node_xyz(ref_node, 0, node),
                                        ref_node_xyz(ref_node, 1, node),
                                        primitive),
          "ringleb");
      for (i = 0; i < 5; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
    } else if (strcmp(function_name, "fp-sa") == 0) {
      REF_INT i;
      REF_DBL primitive[6];
      RSS(ref_acceptance_primal_fp_sa(ref_node_xyz(ref_node, 1, node),
                                      primitive),
          "flat plate sa");
      for (i = 0; i < 6; i++) (*scalar)[i + (*ldim) * node] = primitive[i];
    } else if (strcmp(function_name, "sst") == 0) {
      REF_INT i;
      for (i = 0; i < 7; i++) (*scalar)[i + (*ldim) * node] = (REF_DBL)(i + 1);
    } else {
      printf("%s: %d: %s %s\n", __FILE__, __LINE__, "unknown user function",
             function_name);
      return REF_NOT_FOUND;
    }
  }
  return REF_SUCCESS;
}